

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimdFloat64x2OperationX86X64.cpp
# Opt level: O0

SIMDValue Js::SIMDFloat64x2Operation::OpFromFloat32x4(SIMDValue *value)

{
  _x86_SIMDValue _Var1;
  anon_union_16_9_4d7543c8_for__SIMDValue_0 aVar2;
  X86SIMDValue v;
  X86SIMDValue x86Result;
  SIMDValue *value_local;
  float local_18;
  float fStack_14;
  
  _Var1 = _x86_SIMDValue::ToX86SIMDValue(value);
  local_18 = _Var1.field_0._0_4_;
  fStack_14 = _Var1.field_0._4_4_;
  unique0x10000046 = SUB84((double)fStack_14,0);
  v.field_0._8_8_ = (double)local_18;
  unique0x1000004a = (int)((ulong)(double)fStack_14 >> 0x20);
  aVar2 = (anon_union_16_9_4d7543c8_for__SIMDValue_0)
          _x86_SIMDValue::ToSIMDValue((_x86_SIMDValue *)((long)&v.field_0 + 8));
  return (SIMDValue)aVar2;
}

Assistant:

SIMDValue SIMDFloat64x2Operation::OpFromFloat32x4(const SIMDValue& value)
    {
        X86SIMDValue x86Result;
        X86SIMDValue v = X86SIMDValue::ToX86SIMDValue(value);

        // Converts the lower 2 single-precision, floating-point values
        // to two double-precision, floating-point values
        x86Result.m128d_value = _mm_cvtps_pd(v.m128_value);

        return X86SIMDValue::ToSIMDValue(x86Result);
    }